

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModel::setNameFilters(QFileSystemModel *this,QStringList *filters)

{
  bool bVar1;
  QFileSystemModelPrivate *this_00;
  bool *pbVar2;
  QFileSystemNode *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *persistentIndex;
  QModelIndexList *__range2;
  QFileSystemModelPrivate *d;
  QFileSystemNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  QModelIndexList persistentList;
  QPersistentModelIndex root;
  QFileSystemModelPrivate *in_stack_ffffffffffffff60;
  QFileSystemModel *in_stack_ffffffffffffff68;
  QFileSystemModelPrivate *this_01;
  QFileSystemNode *local_78;
  const_iterator in_stack_ffffffffffffff98;
  const_iterator local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 local_40 [24];
  QFileSystemModel local_28;
  QPersistentModelIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileSystemModel *)0xaa96f4);
  bVar1 = QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::isEmpty
                    (&this_00->bypassFilters);
  if (!bVar1) {
    QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::clear
              ((QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *)
               in_stack_ffffffffffffff60);
    local_10.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    rootPath(in_stack_ffffffffffffff68);
    index(&local_28,(char *)in_RDI,(int)local_40);
    QPersistentModelIndex::QPersistentModelIndex(&local_10,(QModelIndex *)&local_28);
    QString::~QString((QString *)0xaa9777);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemModel::persistentIndexList();
    this_01 = (QFileSystemModelPrivate *)&local_58;
    local_60.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff98 =
         QList<QModelIndex>::end((QList<QModelIndex> *)in_stack_ffffffffffffff60);
    while (bVar1 = QList<QModelIndex>::const_iterator::operator!=
                             (&local_60,in_stack_ffffffffffffff98), bVar1) {
      in_stack_ffffffffffffff60 =
           (QFileSystemModelPrivate *)QList<QModelIndex>::const_iterator::operator*(&local_60);
      local_78 = QFileSystemModelPrivate::node(this_01,(QModelIndex *)in_stack_ffffffffffffff60);
      while ((local_78 != (QFileSystemNode *)0x0 &&
             (bVar1 = QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::contains
                                ((QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *)
                                 this_01,(QFileSystemNode **)in_stack_ffffffffffffff60), !bVar1))) {
        bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir(in_RDI);
        if (bVar1) {
          pbVar2 = QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::operator[]
                             ((QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *)
                              this_00,(QFileSystemNode **)this_01);
          *pbVar2 = true;
        }
        local_78 = local_78->parent;
      }
      QList<QModelIndex>::const_iterator::operator++(&local_60);
    }
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0xaa98c6);
    QPersistentModelIndex::~QPersistentModelIndex(&local_10);
  }
  QList<QString>::operator=((QList<QString> *)in_stack_ffffffffffffff60,(QList<QString> *)in_RDI);
  QFileSystemModelPrivate::rebuildNameFilterRegexps
            ((QFileSystemModelPrivate *)in_stack_ffffffffffffff98.i);
  this_00->forceSort = true;
  QFileSystemModelPrivate::delayedSort(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModel::setNameFilters(const QStringList &filters)
{
#if QT_CONFIG(regularexpression)
    Q_D(QFileSystemModel);

    if (!d->bypassFilters.isEmpty()) {
        // update the bypass filter to only bypass the stuff that must be kept around
        d->bypassFilters.clear();
        // We guarantee that rootPath will stick around
        QPersistentModelIndex root(index(rootPath()));
        const QModelIndexList persistentList = persistentIndexList();
        for (const auto &persistentIndex : persistentList) {
            QFileSystemModelPrivate::QFileSystemNode *node = d->node(persistentIndex);
            while (node) {
                if (d->bypassFilters.contains(node))
                    break;
                if (node->isDir())
                    d->bypassFilters[node] = true;
                node = node->parent;
            }
        }
    }

    d->nameFilters = filters;
    d->rebuildNameFilterRegexps();
    d->forceSort = true;
    d->delayedSort();
#else
    Q_UNUSED(filters);
#endif
}